

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

vector<mjs::value,_std::allocator<mjs::value>_> * __thiscall
mjs::interpreter::impl::eval_argument_list
          (vector<mjs::value,_std::allocator<mjs::value>_> *__return_storage_ptr__,impl *this,
          expression_list *es)

{
  pointer puVar1;
  pointer puVar2;
  value local_80;
  value local_58;
  
  (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (es->
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (es->
                super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    eval(&local_80,this,
         (puVar2->_M_t).
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_58,this,&local_80);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              (__return_storage_ptr__,&local_58);
    value::~value(&local_58);
    value::~value(&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value> eval_argument_list(const expression_list& es) {
        std::vector<value> args;
        for (const auto& e: es) {
            args.push_back(get_value(eval(*e)));
        }
        return args;
    }